

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_units_string(int uu)

{
  switch(uu) {
  case 1:
    return "m";
  case 2:
    return "mm";
  case 3:
    return "um";
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_0010de2b_caseD_4;
  case 8:
    return "s";
  default:
    if (uu == 0x10) {
      return "ms";
    }
    if (uu == 0x18) {
      return "us";
    }
    if (uu == 0x20) {
      return "Hz";
    }
    if (uu == 0x28) {
      return "ppm";
    }
    if (uu == 0x30) {
      return "rad/s";
    }
switchD_0010de2b_caseD_4:
    return "Unknown";
  }
}

Assistant:

char const *nifti_units_string( int uu )
{
   switch( uu ){
     case NIFTI_UNITS_METER:  return "m" ;
     case NIFTI_UNITS_MM:     return "mm" ;
     case NIFTI_UNITS_MICRON: return "um" ;
     case NIFTI_UNITS_SEC:    return "s" ;
     case NIFTI_UNITS_MSEC:   return "ms" ;
     case NIFTI_UNITS_USEC:   return "us" ;
     case NIFTI_UNITS_HZ:     return "Hz" ;
     case NIFTI_UNITS_PPM:    return "ppm" ;
     case NIFTI_UNITS_RADS:   return "rad/s" ;
   }
   return "Unknown" ;
}